

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignData.cpp
# Opt level: O2

int adios2::core::engine::sqlcb_info(void *p,int argc,char **argv,char **azColName)

{
  uint uVar1;
  double dVar2;
  char rest [32];
  allocator local_39;
  string local_38 [40];
  
  std::__cxx11::string::string(local_38,*argv,&local_39);
  std::__cxx11::string::operator=((string *)p,local_38);
  std::__cxx11::string::~string(local_38);
  __isoc99_sscanf(*p,"%d.%d%s",(long)p + 0x20,(long)p + 0x24,local_38);
  if (local_38[0] != (string)0x0) {
    __isoc99_sscanf(local_38,".%d%*s",(long)p + 0x28);
  }
  *(double *)((long)p + 0x30) = (double)*(int *)((long)p + 0x20);
  uVar1 = *(uint *)((long)p + 0x24);
  if ((int)uVar1 < 10) {
    dVar2 = (double)(int)uVar1 / 10.0;
  }
  else {
    if (99 < uVar1) {
      return 0;
    }
    dVar2 = (double)(int)uVar1 / 100.0;
  }
  *(double *)((long)p + 0x30) = dVar2 + (double)*(int *)((long)p + 0x20);
  return 0;
}

Assistant:

static int sqlcb_info(void *p, int argc, char **argv, char **azColName)
{
    CampaignData *cdp = reinterpret_cast<CampaignData *>(p);
    cdp->version.versionStr = std::string(argv[0]);

    char rest[32];
    std::sscanf(cdp->version.versionStr.c_str(), "%d.%d%s", &cdp->version.major,
                &cdp->version.minor, rest);
    if (rest[0])
    {
        sscanf(rest, ".%d%*s", &cdp->version.micro);
    }
    cdp->version.version = double(cdp->version.major);
    if (cdp->version.minor < 10)
        cdp->version.version += double(cdp->version.minor) / 10.0;
    else if (cdp->version.minor < 100)
        cdp->version.version += double(cdp->version.minor) / 100.0;

    return 0;
}